

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_hash_verify(psa_hash_operation_t *operation,uint8_t *hash,size_t hash_length)

{
  psa_status_t pVar1;
  int iVar2;
  size_t actual_hash_length;
  uint8_t actual_hash [64];
  
  pVar1 = psa_hash_finish(operation,actual_hash,0x40,&actual_hash_length);
  if ((pVar1 == 0) && (pVar1 = -0x95, actual_hash_length == hash_length)) {
    iVar2 = safer_memcmp(hash,actual_hash,hash_length);
    pVar1 = -0x95;
    if (iVar2 == 0) {
      pVar1 = 0;
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_hash_verify( psa_hash_operation_t *operation,
                              const uint8_t *hash,
                              size_t hash_length )
{
    uint8_t actual_hash[MBEDTLS_MD_MAX_SIZE];
    size_t actual_hash_length;
    psa_status_t status = psa_hash_finish( operation,
                                           actual_hash, sizeof( actual_hash ),
                                           &actual_hash_length );
    if( status != PSA_SUCCESS )
        return( status );
    if( actual_hash_length != hash_length )
        return( PSA_ERROR_INVALID_SIGNATURE );
    if( safer_memcmp( hash, actual_hash, actual_hash_length ) != 0 )
        return( PSA_ERROR_INVALID_SIGNATURE );
    return( PSA_SUCCESS );
}